

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool ON_IsGsmoothCurvatureContinuous
               (ON_3dVector Km,ON_3dVector Kp,double cos_angle_tolerance,double curvature_tolerance)

{
  bool bVar1;
  double cos_Kangle_tolerance;
  double relative_tolerance;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  
  bVar1 = ON_IsCurvatureDiscontinuity
                    (Km,Kp,0.0,curvature_tolerance,1e-08,-1.23432101234321e+308,1.0);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool ON_IsGsmoothCurvatureContinuous(
  const ON_3dVector Km, 
  const ON_3dVector Kp,
  double cos_angle_tolerance,
  double curvature_tolerance
  )
{
  double relative_tolerance = 1.0; // disables using relative_tolerance to flag unequal scalars

  // point of inflection angle >= 90 degrees
  double cos_Kangle_tolerance = 0.0;

  // Since cos_Kangle_tolerance and rel_tol are valid settings,
  // curvature_tolerance is used only to test for equality.
  return !ON_IsCurvatureDiscontinuity(Km,Kp,
            cos_Kangle_tolerance,
            curvature_tolerance,
            ON_ZERO_CURVATURE_TOLERANCE,
            ON_UNSET_VALUE, // no absolute delta radius tolerance
            relative_tolerance
            );
}